

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool roaring_bitmap_contains_range(roaring_bitmap_t *r,uint64_t range_start,uint64_t range_end)

{
  ushort uVar1;
  int iVar2;
  uint16_t *puVar3;
  void **ppvVar4;
  uint8_t *puVar5;
  bool bVar6;
  uint uVar7;
  _Bool _Var8;
  uint uVar9;
  int *piVar10;
  uint8_t uVar11;
  uint uVar12;
  int iVar13;
  uint32_t range_end_00;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  ushort uVar17;
  int iVar18;
  uint unaff_R14D;
  uint uVar19;
  uint unaff_R15D;
  bool bVar20;
  
  uVar14 = 0x100000000;
  if (range_end < 0x100000000) {
    uVar14 = range_end;
  }
  if (uVar14 <= range_start) {
    return true;
  }
  if (uVar14 - range_start == 1) {
    _Var8 = roaring_bitmap_contains(r,(uint)range_start);
    return _Var8;
  }
  lVar15 = uVar14 - 1;
  uVar12 = (uint)((ulong)lVar15 >> 0x10) & 0xffff;
  uVar9 = (uint)(range_start >> 0x10) & 0xffff;
  iVar13 = uVar12 - uVar9;
  iVar2 = (r->high_low_container).size;
  if (iVar2 <= iVar13) {
    return false;
  }
  if (iVar2 == 0) {
LAB_0010fe93:
    uVar19 = iVar2 - 1;
  }
  else {
    puVar3 = (r->high_low_container).keys;
    uVar17 = (ushort)(range_start >> 0x10);
    if (puVar3[(long)iVar2 + -1] == uVar17) goto LAB_0010fe93;
    iVar18 = iVar2 + -1;
    unaff_R15D = 0;
    do {
      if (iVar18 < (int)unaff_R15D) {
        uVar19 = ~unaff_R15D;
        unaff_R15D = uVar19;
        break;
      }
      uVar19 = unaff_R15D + iVar18 >> 1;
      uVar1 = *(ushort *)((long)puVar3 + (ulong)(unaff_R15D + iVar18 & 0xfffffffe));
      if (uVar1 < uVar17) {
        unaff_R15D = uVar19 + 1;
        bVar6 = true;
        uVar19 = unaff_R14D;
      }
      else if (uVar17 < uVar1) {
        iVar18 = uVar19 - 1;
        bVar6 = true;
        uVar19 = unaff_R14D;
      }
      else {
        bVar6 = false;
      }
      unaff_R14D = uVar19;
    } while (bVar6);
  }
  if (iVar2 != 0) {
    puVar3 = (r->high_low_container).keys;
    uVar17 = (ushort)((ulong)lVar15 >> 0x10);
    if (puVar3[(long)iVar2 + -1] != uVar17) {
      iVar18 = iVar2 + -1;
      uVar16 = 0;
      do {
        if (iVar18 < (int)uVar16) {
          unaff_R15D = ~uVar16;
          break;
        }
        uVar7 = uVar16 + iVar18 >> 1;
        uVar1 = *(ushort *)((long)puVar3 + (ulong)(uVar16 + iVar18 & 0xfffffffe));
        if (uVar1 < uVar17) {
          uVar16 = uVar7 + 1;
          bVar6 = true;
        }
        else if (uVar17 < uVar1) {
          iVar18 = uVar7 - 1;
          bVar6 = true;
        }
        else {
          bVar6 = false;
          unaff_R15D = uVar7;
        }
      } while (bVar6);
      goto LAB_0010feb0;
    }
  }
  unaff_R15D = iVar2 - 1;
LAB_0010feb0:
  if (iVar2 <= (int)unaff_R15D) {
    return false;
  }
  if ((int)unaff_R15D < 0) {
    return false;
  }
  if ((int)uVar19 < 0) {
    return false;
  }
  if (unaff_R15D - uVar19 == iVar13) {
    uVar16 = (uint)range_start & 0xffff;
    range_end_00 = ((uint)lVar15 & 0xffff) + 1;
    ppvVar4 = (r->high_low_container).containers;
    puVar5 = (r->high_low_container).typecodes;
    if (uVar12 == uVar9) {
      _Var8 = container_contains_range
                        (ppvVar4[uVar19 & 0xffff],uVar16,range_end_00,puVar5[uVar19 & 0xffff]);
      return _Var8;
    }
    _Var8 = container_contains_range
                      (ppvVar4[uVar19 & 0xffff],uVar16,0x10000,puVar5[uVar19 & 0xffff]);
    if (!_Var8) {
      return false;
    }
    _Var8 = container_contains_range
                      (ppvVar4[unaff_R15D & 0xffff],0,range_end_00,puVar5[unaff_R15D & 0xffff]);
    if (!_Var8) {
      return false;
    }
    do {
      uVar19 = uVar19 + 1;
      bVar6 = (int)unaff_R15D <= (int)uVar19;
      if ((int)unaff_R15D <= (int)uVar19) {
        return bVar6;
      }
      uVar11 = puVar5[uVar19 & 0xffff];
      piVar10 = (int *)ppvVar4[uVar19 & 0xffff];
      if (uVar11 == '\x04') {
        uVar11 = (uint8_t)piVar10[2];
        piVar10 = *(int **)piVar10;
      }
      if (uVar11 == '\x03') {
        if (*piVar10 != 1) {
          return bVar6;
        }
        if (**(short **)(piVar10 + 2) != 0) {
          return bVar6;
        }
        bVar20 = (*(short **)(piVar10 + 2))[1] == -1;
      }
      else {
        bVar20 = *piVar10 == 0x10000;
      }
      if (!bVar20) {
        return bVar6;
      }
    } while( true );
  }
  return false;
}

Assistant:

bool roaring_bitmap_contains_range(const roaring_bitmap_t *r,
                                   uint64_t range_start, uint64_t range_end) {
    if (range_end >= UINT64_C(0x100000000)) {
        range_end = UINT64_C(0x100000000);
    }
    if (range_start >= range_end)
        return true;  // empty range are always contained!
    if (range_end - range_start == 1)
        return roaring_bitmap_contains(r, (uint32_t)range_start);
    uint16_t hb_rs = (uint16_t)(range_start >> 16);
    uint16_t hb_re = (uint16_t)((range_end - 1) >> 16);
    const int32_t span = hb_re - hb_rs;
    const int32_t hlc_sz = ra_get_size(&r->high_low_container);
    if (hlc_sz < span + 1) {
        return false;
    }
    int32_t is = ra_get_index(&r->high_low_container, hb_rs);
    int32_t ie = ra_get_index(&r->high_low_container, hb_re);
    if ((ie < 0) || (is < 0) || ((ie - is) != span) || ie >= hlc_sz) {
        return false;
    }
    const uint32_t lb_rs = range_start & 0xFFFF;
    const uint32_t lb_re = ((range_end - 1) & 0xFFFF) + 1;
    uint8_t type;
    container_t *c =
        ra_get_container_at_index(&r->high_low_container, (uint16_t)is, &type);
    if (hb_rs == hb_re) {
        return container_contains_range(c, lb_rs, lb_re, type);
    }
    if (!container_contains_range(c, lb_rs, 1 << 16, type)) {
        return false;
    }
    c = ra_get_container_at_index(&r->high_low_container, (uint16_t)ie, &type);
    if (!container_contains_range(c, 0, lb_re, type)) {
        return false;
    }
    for (int32_t i = is + 1; i < ie; ++i) {
        c = ra_get_container_at_index(&r->high_low_container, (uint16_t)i,
                                      &type);
        if (!container_is_full(c, type)) {
            return false;
        }
    }
    return true;
}